

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O3

int32 free_mllr_A(float32 ****A,uint32 n_class,uint32 n_stream)

{
  ulong uVar1;
  ulong uVar2;
  
  if (n_class != 0) {
    uVar1 = 0;
    do {
      if (n_stream != 0) {
        uVar2 = 0;
        do {
          ckd_free_2d(A[uVar1][uVar2]);
          uVar2 = uVar2 + 1;
        } while (n_stream != uVar2);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != n_class);
  }
  ckd_free_2d(A);
  return 0;
}

Assistant:

int32
free_mllr_A(float32 ****A,
	    uint32  n_class,
	    uint32  n_stream)
{
    uint32 i,j;

    for (i=0; i < n_class; i++) {
	for (j=0; j < n_stream; j++) {
	    ckd_free_2d((void **)A[i][j]);
	}
    }
    ckd_free_2d((void **)A);

    return S3_SUCCESS;
}